

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFModelExport.cpp
# Opt level: O0

bool iDynTree::exportXMLBlob(string *xmlBlob,xmlNodePtr parent_element)

{
  undefined8 uVar1;
  undefined8 uVar2;
  char *__s;
  size_t sVar3;
  undefined8 in_RSI;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  xmlNodePtr new_node;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff88;
  undefined8 local_48;
  undefined8 local_20;
  long local_18;
  undefined8 local_10;
  
  local_18 = 0;
  local_10 = in_RSI;
  uVar1 = std::__cxx11::string::begin();
  uVar2 = std::__cxx11::string::end();
  std::
  remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,iDynTree::exportXMLBlob(std::__cxx11::string,_xmlNode*)::__0>
            (uVar1,uVar2);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            (in_RDI,in_stack_ffffffffffffff88);
  std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            (in_RDI,in_stack_ffffffffffffff88);
  std::__cxx11::string::erase(in_RDI,local_20,local_48);
  uVar1 = local_10;
  uVar2 = std::__cxx11::string::c_str();
  __s = (char *)std::__cxx11::string::c_str();
  sVar3 = strlen(__s);
  xmlParseInNodeContext(uVar1,uVar2,sVar3 & 0xffffffff,0,&local_18);
  if (local_18 != 0) {
    xmlAddChild(local_10,local_18);
  }
  return true;
}

Assistant:

bool exportXMLBlob(std::string xmlBlob, xmlNodePtr parent_element) {
     xmlNodePtr new_node = nullptr;
     // Let's remove non printable characters
     xmlBlob.erase(std::remove_if(xmlBlob.begin(), xmlBlob.end(),
         [](unsigned char c) {
             return !std::isprint(c);
         }),
         xmlBlob.end());
    // we assume that 'parent_element' node is already defined
    xmlParseInNodeContext(parent_element, xmlBlob.c_str(), strlen(xmlBlob.c_str()), 0, &new_node);
    if (new_node) xmlAddChild(parent_element, new_node);
    return true;
}